

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SHA1_Hash * __thiscall
ON_SubDEdgeChain::Hash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubDEdgeChain *this)

{
  uint uVar1;
  ON_SubDEdgePtr local_a0;
  ON_SubDEdgePtr eptr;
  uint i;
  uint edge_count;
  ON_SHA1 sha1;
  ON_SubDEdgeChain *this_local;
  
  sha1.m_sha1_hash.m_digest._12_8_ = this;
  ON_SHA1::ON_SHA1((ON_SHA1 *)&i);
  eptr.m_ptr._4_4_ = EdgeCount(this);
  for (eptr.m_ptr._0_4_ = 0; (uint)eptr.m_ptr < eptr.m_ptr._4_4_;
      eptr.m_ptr._0_4_ = (uint)eptr.m_ptr + 1) {
    local_a0 = EdgePtr(this,(uint)eptr.m_ptr);
    uVar1 = ON_SubDEdgePtr::EdgeId(&local_a0);
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)&i,uVar1);
    uVar1 = ON_SubDEdgePtr::RelativeVertexId(&local_a0,0);
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)&i,uVar1);
    uVar1 = ON_SubDEdgePtr::RelativeVertexId(&local_a0,1);
    ON_SHA1::AccumulateInteger32((ON_SHA1 *)&i,uVar1);
  }
  ON_SHA1::Hash(__return_storage_ptr__,(ON_SHA1 *)&i);
  return __return_storage_ptr__;
}

Assistant:

const ON_SHA1_Hash ON_SubDEdgeChain::Hash() const
{
  ON_SHA1 sha1;
  const unsigned edge_count = this->EdgeCount();
  for (unsigned i = 0; i < edge_count; ++i)
  {
    const ON_SubDEdgePtr eptr = EdgePtr(i);
    sha1.AccumulateInteger32(eptr.EdgeId());
    sha1.AccumulateInteger32(eptr.RelativeVertexId(0));
    sha1.AccumulateInteger32(eptr.RelativeVertexId(1));
  }
  return sha1.Hash();
}